

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SonarLocalization.cpp
# Opt level: O0

void * SonarLocalizationThread(void *pParam)

{
  bool bVar1;
  interval *piVar2;
  double dVar3;
  double dVar4;
  double local_a68;
  double local_a60;
  interval local_a58;
  double local_a40;
  double local_a38;
  interval local_a30;
  box local_a18;
  double local_a08;
  interval local_a00;
  double local_9e8;
  interval local_9e0;
  box local_9c8;
  box local_9b8;
  double local_9a8;
  interval local_9a0;
  double local_988;
  interval local_980;
  box local_968;
  box local_958;
  double local_948;
  double snr_loc_max_err_1;
  double local_938;
  interval local_930;
  double local_918;
  double local_910;
  interval local_908;
  box local_8f0;
  interval local_8e0;
  interval local_8c8;
  undefined1 local_8b0 [8];
  box P0_1;
  box local_890;
  undefined1 local_880 [8];
  vector<double,_std::allocator<double>_> circles_r_tmp_1;
  vector<double,_std::allocator<double>_> circles_y_tmp_1;
  vector<double,_std::allocator<double>_> circles_x_tmp_1;
  vector<double,_std::allocator<double>_> walls_yb_tmp_1;
  vector<double,_std::allocator<double>_> walls_xb_tmp_1;
  vector<double,_std::allocator<double>_> walls_ya_tmp_1;
  vector<double,_std::allocator<double>_> walls_xa_tmp_1;
  undefined1 local_7d0 [8];
  interval alphashat_tmp_1;
  double dStack_7b0;
  int sdir_tmp_1;
  double alpha_max_err_tmp_1;
  double d_max_err_tmp_1;
  deque<interval,_std::allocator<interval>_> vrxhat_history_vector_tmp;
  deque<interval,_std::allocator<interval>_> psihat_history_vector_tmp;
  deque<interval,_std::allocator<interval>_> yhat_history_vector_tmp;
  deque<interval,_std::allocator<interval>_> xhat_history_vector_tmp;
  deque<double,_std::allocator<double>_> t_history_vector_tmp;
  deque<double,_std::allocator<double>_> alpha_mes_vector_tmp_1;
  deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
  d_all_mes_vector_tmp_1;
  double local_568;
  interval local_560;
  double local_548;
  double local_540;
  interval local_538;
  box local_520;
  interval local_510;
  interval local_4f8;
  undefined1 local_4e0 [8];
  box P_1;
  double local_4c8;
  interval local_4c0;
  double local_4a8;
  double local_4a0;
  interval local_498;
  box local_480;
  double local_470;
  interval local_468;
  double local_450;
  interval local_448;
  box local_430;
  box local_420;
  double local_410;
  interval local_408;
  double local_3f0;
  interval local_3e8;
  box local_3d0;
  box local_3c0;
  double local_3b0;
  double snr_loc_max_err;
  double local_3a0;
  interval local_398;
  double local_380;
  double local_378;
  interval local_370;
  box local_358;
  interval local_348;
  interval local_330;
  undefined1 local_318 [8];
  box P0;
  box local_2f8;
  undefined1 local_2e8 [8];
  vector<double,_std::allocator<double>_> circles_r_tmp;
  vector<double,_std::allocator<double>_> circles_y_tmp;
  vector<double,_std::allocator<double>_> circles_x_tmp;
  vector<double,_std::allocator<double>_> walls_yb_tmp;
  vector<double,_std::allocator<double>_> walls_xb_tmp;
  vector<double,_std::allocator<double>_> walls_ya_tmp;
  vector<double,_std::allocator<double>_> walls_xa_tmp;
  undefined1 local_238 [8];
  interval alphashat_tmp;
  double dStack_218;
  int sdir_tmp;
  double alpha_max_err_tmp;
  double d_max_err_tmp;
  interval psihat_tmp;
  deque<double,_std::allocator<double>_> alpha_mes_vector_tmp;
  deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
  d_all_mes_vector_tmp;
  double local_148;
  interval local_140;
  double local_128;
  double local_120;
  interval local_118;
  box local_100 [2];
  interval local_e0;
  interval local_c8;
  undefined1 local_b0 [8];
  box P;
  CHRONO chrono_dynamicsonarlocalization;
  CHRONO chrono_period;
  void *pParam_local;
  
  bDynamicSonarLocalization = 0;
  StartChrono((CHRONO *)&P.dim);
  StartChrono((CHRONO *)&chrono_dynamicsonarlocalization.Suspended);
  do {
    StopChronoQuick((CHRONO *)&chrono_dynamicsonarlocalization.Suspended);
    StartChrono((CHRONO *)&chrono_dynamicsonarlocalization.Suspended);
    uSleep(50000);
    if (bStaticSonarLocalization != 0) {
      EnterCriticalSection(&StateVariablesCS);
      interval::interval(&local_c8,(interval *)&xhat);
      interval::interval(&local_e0,(interval *)&yhat);
      box::box((box *)local_b0,(vector<interval,_std::allocator<interval>_> *)&local_c8,
               (vector<interval,_std::allocator<interval>_> *)&local_e0);
      bVar1 = box::IsEmpty((box *)local_b0);
      if (bVar1) {
        local_120 = -10000.0;
        local_128 = 10000.0;
        interval::interval(&local_118,&local_120,&local_128);
        local_148 = -10000.0;
        d_all_mes_vector_tmp.
        super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x40c3880000000000;
        interval::interval(&local_140,&local_148,
                           (double *)
                           &d_all_mes_vector_tmp.
                            super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
        box::box(local_100,(vector<interval,_std::allocator<interval>_> *)&local_118,
                 (vector<interval,_std::allocator<interval>_> *)&local_140);
        box::operator=((box *)local_b0,local_100);
        box::~box(local_100);
      }
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::deque((deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
               *)&alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,&d_all_mes_vector);
      std::deque<double,_std::allocator<double>_>::deque
                ((deque<double,_std::allocator<double>_> *)&psihat_tmp.isEmpty,&alpha_mes_vector);
      interval::interval((interval *)&d_max_err_tmp,(interval *)&psihat);
      alpha_max_err_tmp = d_max_err;
      dStack_218 = alpha_max_err;
      alphashat_tmp._20_4_ = 1;
      walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      interval::interval((interval *)local_238,
                         (double *)
                         &walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_xa);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_ya);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_xb);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_yb);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&circles_x);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&circles_y);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_2e8,&circles_r);
      LeaveCriticalSection(&StateVariablesCS);
      ThreadYield();
      box::box((box *)&P0.dim,(box *)local_b0);
      SIVIA(&local_2f8,
            (deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
             *)&P0.dim,
            (deque<double,_std::allocator<double>_> *)
            &alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node,(interval *)&psihat_tmp.isEmpty,&d_max_err_tmp
            ,&alpha_max_err_tmp,(int *)&stack0xfffffffffffffde8,
            (interval *)&alphashat_tmp.field_0x14,
            (vector<double,_std::allocator<double>_> *)local_238,
            (vector<double,_std::allocator<double>_> *)
            &walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<double,_std::allocator<double>_> *)
            &walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<double,_std::allocator<double>_> *)
            &walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<double,_std::allocator<double>_> *)
            &circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<double,_std::allocator<double>_> *)
            &circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<double,_std::allocator<double>_> *)
            &circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
      box::operator=((box *)local_b0,&local_2f8);
      box::~box(&local_2f8);
      box::~box((box *)&P0.dim);
      ThreadYield();
      EnterCriticalSection(&StateVariablesCS);
      interval::interval(&local_330,(interval *)&xhat);
      interval::interval(&local_348,(interval *)&yhat);
      box::box((box *)local_318,(vector<interval,_std::allocator<interval>_> *)&local_330,
               (vector<interval,_std::allocator<interval>_> *)&local_348);
      bVar1 = box::IsEmpty((box *)local_318);
      if (bVar1) {
        local_378 = -10000.0;
        local_380 = 10000.0;
        interval::interval(&local_370,&local_378,&local_380);
        local_3a0 = -10000.0;
        snr_loc_max_err = 10000.0;
        interval::interval(&local_398,&local_3a0,&snr_loc_max_err);
        box::box(&local_358,(vector<interval,_std::allocator<interval>_> *)&local_370,
                 (vector<interval,_std::allocator<interval>_> *)&local_398);
        box::operator=((box *)local_318,&local_358);
        box::~box(&local_358);
      }
      box::Intersect((box *)local_b0,(box *)local_318);
      dVar4 = d_max_err;
      dVar3 = sin(alpha_max_err);
      local_3b0 = ABS(dVar4 + dVar3 + dVar4 + dVar3);
      bVar1 = box::IsEmpty((box *)local_b0);
      if (bVar1) {
        local_3f0 = -local_3b0;
        interval::interval(&local_3e8,&local_3f0,&local_3b0);
        local_410 = -local_3b0;
        interval::interval(&local_408,&local_410,&local_3b0);
        box::box(&local_3d0,(vector<interval,_std::allocator<interval>_> *)&local_3e8,
                 (vector<interval,_std::allocator<interval>_> *)&local_408);
        operator+(&local_3c0,(box *)local_318);
        box::operator=((box *)local_b0,&local_3c0);
        box::~box(&local_3c0);
        box::~box(&local_3d0);
      }
      else {
        local_450 = -local_3b0;
        interval::interval(&local_448,&local_450,&local_3b0);
        local_470 = -local_3b0;
        interval::interval(&local_468,&local_470,&local_3b0);
        box::box(&local_430,(vector<interval,_std::allocator<interval>_> *)&local_448,
                 (vector<interval,_std::allocator<interval>_> *)&local_468);
        operator+(&local_420,(box *)local_b0);
        box::operator=((box *)local_b0,&local_420);
        box::~box(&local_420);
        box::~box(&local_430);
      }
      bVar1 = box::IsEmpty((box *)local_b0);
      if (bVar1) {
        local_4a0 = -10000.0;
        local_4a8 = 10000.0;
        interval::interval(&local_498,&local_4a0,&local_4a8);
        local_4c8 = -10000.0;
        P_1.dim = 0;
        P_1._12_4_ = 0x40c38800;
        interval::interval(&local_4c0,&local_4c8,(double *)&P_1.dim);
        box::box(&local_480,(vector<interval,_std::allocator<interval>_> *)&local_498,
                 (vector<interval,_std::allocator<interval>_> *)&local_4c0);
        box::operator=((box *)local_b0,&local_480);
        box::~box(&local_480);
      }
      piVar2 = box::operator[]((box *)local_b0,1);
      interval::operator=((interval *)&xhat,piVar2);
      piVar2 = box::operator[]((box *)local_b0,2);
      interval::operator=((interval *)&yhat,piVar2);
      LeaveCriticalSection(&StateVariablesCS);
      bStaticSonarLocalization = 0;
      box::~box((box *)local_318);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_2e8);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::deque<double,_std::allocator<double>_>::~deque
                ((deque<double,_std::allocator<double>_> *)&psihat_tmp.isEmpty);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::~deque((deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                *)&alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node);
      box::~box((box *)local_b0);
    }
    if ((bDynamicSonarLocalization != 0) &&
       (dVar4 = GetTimeElapsedChronoQuick((CHRONO *)&P.dim), dynamicsonarlocalization_period < dVar4
       )) {
      EnterCriticalSection(&StateVariablesCS);
      interval::interval(&local_4f8,(interval *)&xhat);
      interval::interval(&local_510,(interval *)&yhat);
      box::box((box *)local_4e0,(vector<interval,_std::allocator<interval>_> *)&local_4f8,
               (vector<interval,_std::allocator<interval>_> *)&local_510);
      bVar1 = box::IsEmpty((box *)local_4e0);
      if (bVar1) {
        local_540 = -10000.0;
        local_548 = 10000.0;
        interval::interval(&local_538,&local_540,&local_548);
        local_568 = -10000.0;
        d_all_mes_vector_tmp_1.
        super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x40c3880000000000;
        interval::interval(&local_560,&local_568,
                           (double *)
                           &d_all_mes_vector_tmp_1.
                            super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
        box::box(&local_520,(vector<interval,_std::allocator<interval>_> *)&local_538,
                 (vector<interval,_std::allocator<interval>_> *)&local_560);
        box::operator=((box *)local_4e0,&local_520);
        box::~box(&local_520);
      }
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::deque((deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
               *)&alpha_mes_vector_tmp_1.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,&d_all_mes_vector);
      std::deque<double,_std::allocator<double>_>::deque
                ((deque<double,_std::allocator<double>_> *)
                 &t_history_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,&alpha_mes_vector);
      std::deque<double,_std::allocator<double>_>::deque
                ((deque<double,_std::allocator<double>_> *)
                 &xhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,&t_history_vector);
      std::deque<interval,_std::allocator<interval>_>::deque
                ((deque<interval,_std::allocator<interval>_> *)
                 &yhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,&xhat_history_vector);
      std::deque<interval,_std::allocator<interval>_>::deque
                ((deque<interval,_std::allocator<interval>_> *)
                 &psihat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,&yhat_history_vector);
      std::deque<interval,_std::allocator<interval>_>::deque
                ((deque<interval,_std::allocator<interval>_> *)
                 &vrxhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,&psihat_history_vector);
      std::deque<interval,_std::allocator<interval>_>::deque
                ((deque<interval,_std::allocator<interval>_> *)&d_max_err_tmp_1,
                 &vrxhat_history_vector);
      alpha_max_err_tmp_1 = d_max_err;
      dStack_7b0 = alpha_max_err;
      alphashat_tmp_1._20_4_ = 1;
      walls_xa_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      interval::interval((interval *)local_7d0,
                         (double *)
                         &walls_xa_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_ya_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_xa);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_xb_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_ya);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_yb_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_xb);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_x_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&walls_yb);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&circles_x);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&circles_y);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_880,&circles_r);
      LeaveCriticalSection(&StateVariablesCS);
      ThreadYield();
      box::box((box *)&P0_1.dim,(box *)local_4e0);
      SIVIA_dyn(&local_890,
                (deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                 *)&P0_1.dim,
                (deque<double,_std::allocator<double>_> *)
                &alpha_mes_vector_tmp_1.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node,
                (deque<double,_std::allocator<double>_> *)
                &t_history_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node,
                (deque<interval,_std::allocator<interval>_> *)
                &xhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node,
                (deque<interval,_std::allocator<interval>_> *)
                &yhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node,
                (deque<interval,_std::allocator<interval>_> *)
                &psihat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node,
                (deque<interval,_std::allocator<interval>_> *)
                &vrxhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node,&d_max_err_tmp_1,
                &alpha_max_err_tmp_1,(int *)&stack0xfffffffffffff850,
                (interval *)&alphashat_tmp_1.field_0x14,
                (vector<double,_std::allocator<double>_> *)local_7d0,
                (vector<double,_std::allocator<double>_> *)
                &walls_ya_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<double,_std::allocator<double>_> *)
                &walls_xb_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<double,_std::allocator<double>_> *)
                &walls_yb_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<double,_std::allocator<double>_> *)
                &circles_x_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<double,_std::allocator<double>_> *)
                &circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<double,_std::allocator<double>_> *)
                &circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      box::operator=((box *)local_4e0,&local_890);
      box::~box(&local_890);
      box::~box((box *)&P0_1.dim);
      ThreadYield();
      EnterCriticalSection(&StateVariablesCS);
      interval::interval(&local_8c8,(interval *)&xhat);
      interval::interval(&local_8e0,(interval *)&yhat);
      box::box((box *)local_8b0,(vector<interval,_std::allocator<interval>_> *)&local_8c8,
               (vector<interval,_std::allocator<interval>_> *)&local_8e0);
      bVar1 = box::IsEmpty((box *)local_8b0);
      if (bVar1) {
        local_910 = -10000.0;
        local_918 = 10000.0;
        interval::interval(&local_908,&local_910,&local_918);
        local_938 = -10000.0;
        snr_loc_max_err_1 = 10000.0;
        interval::interval(&local_930,&local_938,&snr_loc_max_err_1);
        box::box(&local_8f0,(vector<interval,_std::allocator<interval>_> *)&local_908,
                 (vector<interval,_std::allocator<interval>_> *)&local_930);
        box::operator=((box *)local_8b0,&local_8f0);
        box::~box(&local_8f0);
      }
      box::Intersect((box *)local_4e0,(box *)local_8b0);
      dVar4 = d_max_err;
      dVar3 = sin(alpha_max_err);
      local_948 = ABS(dVar4 + dVar3 + dVar4 + dVar3);
      bVar1 = box::IsEmpty((box *)local_4e0);
      if (bVar1) {
        local_988 = -local_948;
        interval::interval(&local_980,&local_988,&local_948);
        local_9a8 = -local_948;
        interval::interval(&local_9a0,&local_9a8,&local_948);
        box::box(&local_968,(vector<interval,_std::allocator<interval>_> *)&local_980,
                 (vector<interval,_std::allocator<interval>_> *)&local_9a0);
        operator+(&local_958,(box *)local_8b0);
        box::operator=((box *)local_4e0,&local_958);
        box::~box(&local_958);
        box::~box(&local_968);
      }
      else {
        local_9e8 = -local_948;
        interval::interval(&local_9e0,&local_9e8,&local_948);
        local_a08 = -local_948;
        interval::interval(&local_a00,&local_a08,&local_948);
        box::box(&local_9c8,(vector<interval,_std::allocator<interval>_> *)&local_9e0,
                 (vector<interval,_std::allocator<interval>_> *)&local_a00);
        operator+(&local_9b8,(box *)local_4e0);
        box::operator=((box *)local_4e0,&local_9b8);
        box::~box(&local_9b8);
        box::~box(&local_9c8);
      }
      bVar1 = box::IsEmpty((box *)local_4e0);
      if (bVar1) {
        local_a38 = -10000.0;
        local_a40 = 10000.0;
        interval::interval(&local_a30,&local_a38,&local_a40);
        local_a60 = -10000.0;
        local_a68 = 10000.0;
        interval::interval(&local_a58,&local_a60,&local_a68);
        box::box(&local_a18,(vector<interval,_std::allocator<interval>_> *)&local_a30,
                 (vector<interval,_std::allocator<interval>_> *)&local_a58);
        box::operator=((box *)local_4e0,&local_a18);
        box::~box(&local_a18);
      }
      piVar2 = box::operator[]((box *)local_4e0,1);
      interval::operator=((interval *)&xhat,piVar2);
      piVar2 = box::operator[]((box *)local_4e0,2);
      interval::operator=((interval *)&yhat,piVar2);
      LeaveCriticalSection(&StateVariablesCS);
      StopChronoQuick((CHRONO *)&P.dim);
      StartChrono((CHRONO *)&P.dim);
      box::~box((box *)local_8b0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_880);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &circles_x_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_yb_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_xb_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &walls_ya_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::deque<interval,_std::allocator<interval>_>::~deque
                ((deque<interval,_std::allocator<interval>_> *)&d_max_err_tmp_1);
      std::deque<interval,_std::allocator<interval>_>::~deque
                ((deque<interval,_std::allocator<interval>_> *)
                 &vrxhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
      std::deque<interval,_std::allocator<interval>_>::~deque
                ((deque<interval,_std::allocator<interval>_> *)
                 &psihat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
      std::deque<interval,_std::allocator<interval>_>::~deque
                ((deque<interval,_std::allocator<interval>_> *)
                 &yhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
      std::deque<double,_std::allocator<double>_>::~deque
                ((deque<double,_std::allocator<double>_> *)
                 &xhat_history_vector_tmp.super__Deque_base<interval,_std::allocator<interval>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
      std::deque<double,_std::allocator<double>_>::~deque
                ((deque<double,_std::allocator<double>_> *)
                 &t_history_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::~deque((deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                *)&alpha_mes_vector_tmp_1.super__Deque_base<double,_std::allocator<double>_>._M_impl
                   .super__Deque_impl_data._M_finish._M_node);
      box::~box((box *)local_4e0);
    }
  } while (bExit == 0);
  StopChronoQuick((CHRONO *)&chrono_dynamicsonarlocalization.Suspended);
  StopChronoQuick((CHRONO *)&P.dim);
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SonarLocalizationThread(void* pParam)
{
	CHRONO chrono_period;
	CHRONO chrono_dynamicsonarlocalization;

	UNREFERENCED_PARAMETER(pParam);

	// Dynamic sonar localization disabled by default, use enable/disabledynamicsonarlocalization commands to enable/disable...
	bDynamicSonarLocalization = FALSE;

	StartChrono(&chrono_dynamicsonarlocalization);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		uSleep(1000*50);

		if (bStaticSonarLocalization)
		{

			// What if there is no sonar connected...?


			EnterCriticalSection(&StateVariablesCS);
			// Initial box to be able to contract...?
			box P = box(xhat,yhat);
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));

			deque< vector<interval> > d_all_mes_vector_tmp = d_all_mes_vector; deque<double> alpha_mes_vector_tmp = alpha_mes_vector; 
			interval psihat_tmp = psihat; 
			double d_max_err_tmp = d_max_err; double alpha_max_err_tmp = alpha_max_err; int sdir_tmp = 1; interval alphashat_tmp = 0; 
			vector<double> walls_xa_tmp = walls_xa; vector<double> walls_ya_tmp = walls_ya; vector<double> walls_xb_tmp = walls_xb; vector<double> walls_yb_tmp = walls_yb; 
			vector<double> circles_x_tmp = circles_x; vector<double> circles_y_tmp = circles_y; vector<double> circles_r_tmp = circles_r;
			LeaveCriticalSection(&StateVariablesCS);

			ThreadYield();

			P = SIVIA(P, d_all_mes_vector_tmp, alpha_mes_vector_tmp, 
				psihat_tmp, 
				d_max_err_tmp, alpha_max_err_tmp, sdir_tmp, alphashat_tmp, 
				walls_xa_tmp, walls_ya_tmp, walls_xb_tmp, walls_yb_tmp, 
				circles_x_tmp, circles_y_tmp, circles_r_tmp);

			ThreadYield();

			EnterCriticalSection(&StateVariablesCS);
			box P0 = box(xhat,yhat); // Need to check for other position updates since the computations were long...
			if (P0.IsEmpty()) P0 = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			P.Intersect(P0);
			double snr_loc_max_err = fabs(2*(d_max_err+sin(alpha_max_err)));
			if (P.IsEmpty()) 
			{
				// Expand initial box to be able to contract next time and because we are probably lost...
				P = P0+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			else
			{
				// P is likely to be with a small width so we expand...
				P = P+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			xhat = P[1];
			yhat = P[2];
			LeaveCriticalSection(&StateVariablesCS);

			bStaticSonarLocalization = FALSE;
		}

		if (bDynamicSonarLocalization&&(GetTimeElapsedChronoQuick(&chrono_dynamicsonarlocalization) > dynamicsonarlocalization_period))
		{

			// What if there is no sonar connected...?


			EnterCriticalSection(&StateVariablesCS);
			// Initial box to be able to contract...?
			box P = box(xhat,yhat);
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));

			deque< vector<interval> > d_all_mes_vector_tmp = d_all_mes_vector; deque<double> alpha_mes_vector_tmp = alpha_mes_vector; 
			deque<double> t_history_vector_tmp = t_history_vector; deque<interval> xhat_history_vector_tmp = xhat_history_vector; deque<interval> yhat_history_vector_tmp = yhat_history_vector; 
			deque<interval> psihat_history_vector_tmp = psihat_history_vector; deque<interval> vrxhat_history_vector_tmp = vrxhat_history_vector; 
			double d_max_err_tmp = d_max_err; double alpha_max_err_tmp = alpha_max_err; int sdir_tmp = 1; interval alphashat_tmp = 0; 
			vector<double> walls_xa_tmp = walls_xa; vector<double> walls_ya_tmp = walls_ya; vector<double> walls_xb_tmp = walls_xb; vector<double> walls_yb_tmp = walls_yb; 
			vector<double> circles_x_tmp = circles_x; vector<double> circles_y_tmp = circles_y; vector<double> circles_r_tmp = circles_r;
			LeaveCriticalSection(&StateVariablesCS);

			ThreadYield();

			P = SIVIA_dyn(P, d_all_mes_vector_tmp, alpha_mes_vector_tmp, 
				t_history_vector_tmp, xhat_history_vector_tmp, yhat_history_vector_tmp, 
				psihat_history_vector_tmp, vrxhat_history_vector_tmp, 
				d_max_err_tmp, alpha_max_err_tmp, sdir_tmp, alphashat_tmp, 
				walls_xa_tmp, walls_ya_tmp, walls_xb_tmp, walls_yb_tmp, 
				circles_x_tmp, circles_y_tmp, circles_r_tmp);

			ThreadYield();

			EnterCriticalSection(&StateVariablesCS);
			box P0 = box(xhat,yhat); // Need to check for other position updates since the computations were long...
			if (P0.IsEmpty()) P0 = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			P.Intersect(P0);
			double snr_loc_max_err = fabs(2*(d_max_err+sin(alpha_max_err)));
			if (P.IsEmpty()) 
			{
				// Expand initial box to be able to contract next time and because we are probably lost...
				P = P0+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			else
			{
				// P is likely to be with a small width so we expand...
				P = P+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			xhat = P[1];
			yhat = P[2];
			LeaveCriticalSection(&StateVariablesCS);

			StopChronoQuick(&chrono_dynamicsonarlocalization);
			StartChrono(&chrono_dynamicsonarlocalization);
		}

		//printf("SonarLocalizationThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));

		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_dynamicsonarlocalization);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}